

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMiIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  RayK<8> *pRVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  NodeRef root;
  float *pfVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  size_t k;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [28];
  undefined1 auVar50 [24];
  int iVar51;
  float *vertices;
  ulong uVar52;
  ulong uVar53;
  undefined1 (*pauVar54) [32];
  ulong uVar55;
  ulong *puVar56;
  ulong uVar57;
  undefined4 uVar58;
  ulong unaff_R15;
  bool bVar59;
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  float fVar69;
  float fVar70;
  float fVar79;
  float fVar81;
  undefined1 auVar71 [16];
  float fVar85;
  float fVar86;
  float fVar87;
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  float fVar80;
  float fVar82;
  float fVar83;
  float fVar84;
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar88 [32];
  float fVar94;
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar110 [64];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  float fVar124;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar125 [32];
  undefined1 auVar133 [32];
  float fVar134;
  undefined1 auVar135 [32];
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  undefined1 in_ZMM14 [64];
  undefined1 auVar136 [64];
  undefined1 auVar143 [32];
  undefined1 auVar144 [64];
  Precalculations pre;
  vuint<4> *v;
  vbool<8> terminated;
  RTCFilterFunctionNArguments args;
  TravRayK<8,_true> tray;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  Precalculations local_2d39;
  ulong local_2d38;
  BVH *local_2d30;
  Intersectors *local_2d28;
  RayQueryContext *local_2d20;
  RayK<8> *local_2d18;
  ulong local_2d10;
  RayK<8> *local_2d08;
  undefined1 local_2d00 [8];
  undefined1 auStack_2cf8 [8];
  float fStack_2cf0;
  float fStack_2cec;
  float fStack_2ce8;
  undefined1 local_2ce0 [32];
  undefined1 local_2cc0 [32];
  ulong local_2c98;
  Scene *local_2c90;
  long local_2c88;
  undefined1 local_2c80 [32];
  undefined1 local_2c60 [32];
  RTCFilterFunctionNArguments local_2c30;
  undefined1 local_2c00 [32];
  undefined1 local_2be0 [32];
  undefined8 local_2bc0;
  undefined8 uStack_2bb8;
  undefined8 local_2bb0;
  undefined8 uStack_2ba8;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2ba0;
  undefined1 local_2b40 [32];
  undefined1 local_2b20 [32];
  undefined1 local_2b00 [32];
  undefined1 local_2ae0 [8];
  float fStack_2ad8;
  float fStack_2ad4;
  float fStack_2ad0;
  float fStack_2acc;
  float fStack_2ac8;
  undefined1 local_2ac0 [32];
  undefined1 local_2aa0 [32];
  undefined1 local_2a80 [32];
  undefined1 local_2a60 [32];
  undefined1 local_2a40 [32];
  undefined1 local_2a20 [32];
  undefined1 local_2a00 [32];
  undefined1 local_29e0 [32];
  undefined1 local_29c0 [32];
  undefined1 local_29a0 [32];
  undefined1 local_2980 [32];
  undefined1 local_2960 [32];
  undefined1 local_2940 [32];
  undefined1 local_2920 [32];
  undefined1 local_2900 [8];
  float fStack_28f8;
  float fStack_28f4;
  float fStack_28f0;
  float fStack_28ec;
  float fStack_28e8;
  undefined1 local_28e0 [8];
  float fStack_28d8;
  float fStack_28d4;
  float fStack_28d0;
  float fStack_28cc;
  float fStack_28c8;
  undefined1 local_28c0 [32];
  float local_28a0;
  float fStack_289c;
  float fStack_2898;
  float fStack_2894;
  float fStack_2890;
  float fStack_288c;
  float fStack_2888;
  undefined4 uStack_2884;
  undefined4 local_2880;
  undefined4 uStack_287c;
  undefined4 uStack_2878;
  undefined4 uStack_2874;
  undefined4 uStack_2870;
  undefined4 uStack_286c;
  undefined4 uStack_2868;
  undefined4 uStack_2864;
  undefined1 local_2860 [32];
  undefined1 local_2840 [32];
  undefined1 local_2820 [32];
  undefined1 local_2800 [32];
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  undefined8 local_2720;
  undefined8 uStack_2718;
  undefined8 uStack_2710;
  undefined8 uStack_2708;
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  uint local_2680;
  uint uStack_267c;
  uint uStack_2678;
  uint uStack_2674;
  uint uStack_2670;
  uint uStack_266c;
  uint uStack_2668;
  uint uStack_2664;
  uint local_2660;
  uint uStack_265c;
  uint uStack_2658;
  uint uStack_2654;
  uint uStack_2650;
  uint uStack_264c;
  uint uStack_2648;
  uint uStack_2644;
  uint local_2640;
  uint uStack_263c;
  uint uStack_2638;
  uint uStack_2634;
  uint uStack_2630;
  uint uStack_262c;
  uint uStack_2628;
  uint uStack_2624;
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  undefined1 auVar109 [64];
  undefined1 auVar126 [64];
  
  local_2d30 = (BVH *)This->ptr;
  if ((local_2d30->root).ptr != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar93 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar71 = ZEXT816(0) << 0x40;
      auVar76 = vpcmpeqd_avx2(auVar93,(undefined1  [32])valid_i->field_0);
      auVar93 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar71),5);
      auVar72 = auVar76 & auVar93;
      if ((((((((auVar72 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar72 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar72 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar72 >> 0x7f,0) != '\0') ||
            (auVar72 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar72 >> 0xbf,0) != '\0') ||
          (auVar72 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar72[0x1f] < '\0') {
        auVar93 = vandps_avx(auVar93,auVar76);
        auVar17 = vpackssdw_avx(auVar93._0_16_,auVar93._16_16_);
        local_2ba0._0_8_ = *(undefined8 *)ray;
        local_2ba0._8_8_ = *(undefined8 *)(ray + 8);
        local_2ba0._16_8_ = *(undefined8 *)(ray + 0x10);
        local_2ba0._24_8_ = *(undefined8 *)(ray + 0x18);
        local_2ba0._32_8_ = *(undefined8 *)(ray + 0x20);
        local_2ba0._40_8_ = *(undefined8 *)(ray + 0x28);
        local_2ba0._48_8_ = *(undefined8 *)(ray + 0x30);
        local_2ba0._56_8_ = *(undefined8 *)(ray + 0x38);
        local_2ba0._64_8_ = *(undefined8 *)(ray + 0x40);
        local_2ba0._72_8_ = *(undefined8 *)(ray + 0x48);
        local_2ba0._80_8_ = *(undefined8 *)(ray + 0x50);
        local_2ba0._88_8_ = *(undefined8 *)(ray + 0x58);
        local_2b40 = *(undefined1 (*) [32])(ray + 0x80);
        local_2b20 = *(undefined1 (*) [32])(ray + 0xa0);
        auVar125._8_4_ = 0x7fffffff;
        auVar125._0_8_ = 0x7fffffff7fffffff;
        auVar125._12_4_ = 0x7fffffff;
        auVar125._16_4_ = 0x7fffffff;
        auVar125._20_4_ = 0x7fffffff;
        auVar125._24_4_ = 0x7fffffff;
        auVar125._28_4_ = 0x7fffffff;
        auVar126 = ZEXT3264(auVar125);
        auVar107._8_4_ = 0x219392ef;
        auVar107._0_8_ = 0x219392ef219392ef;
        auVar107._12_4_ = 0x219392ef;
        auVar107._16_4_ = 0x219392ef;
        auVar107._20_4_ = 0x219392ef;
        auVar107._24_4_ = 0x219392ef;
        auVar107._28_4_ = 0x219392ef;
        auVar133._8_4_ = 0x3f800000;
        auVar133._0_8_ = &DAT_3f8000003f800000;
        auVar133._12_4_ = 0x3f800000;
        auVar133._16_4_ = 0x3f800000;
        auVar133._20_4_ = 0x3f800000;
        auVar133._24_4_ = 0x3f800000;
        auVar133._28_4_ = 0x3f800000;
        local_2b00 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar99 = vdivps_avx(auVar133,local_2b40);
        auVar93 = vandps_avx(auVar125,local_2b40);
        auVar72 = vcmpps_avx(auVar93,auVar107,1);
        auVar93 = vandps_avx(auVar125,local_2b20);
        auVar76 = vcmpps_avx(auVar93,auVar107,1);
        auVar115 = ZEXT3264(auVar76);
        auVar103 = vdivps_avx(auVar133,local_2b20);
        auVar93 = vandps_avx(auVar125,local_2b00);
        auVar77._8_4_ = 0x5d5e0b6b;
        auVar77._0_8_ = 0x5d5e0b6b5d5e0b6b;
        auVar77._12_4_ = 0x5d5e0b6b;
        auVar77._16_4_ = 0x5d5e0b6b;
        auVar77._20_4_ = 0x5d5e0b6b;
        auVar77._24_4_ = 0x5d5e0b6b;
        auVar77._28_4_ = 0x5d5e0b6b;
        auVar121 = ZEXT3264(auVar77);
        _local_2ae0 = vblendvps_avx(auVar99,auVar77,auVar72);
        auVar93 = vcmpps_avx(auVar93,auVar107,1);
        auVar72 = vdivps_avx(auVar133,local_2b00);
        local_2ac0 = vblendvps_avx(auVar103,auVar77,auVar76);
        local_2aa0 = vblendvps_avx(auVar72,auVar77,auVar93);
        auVar93 = vcmpps_avx(_local_2ae0,ZEXT1632(auVar71),1);
        auVar103._8_4_ = 0x10;
        auVar103._0_8_ = 0x1000000010;
        auVar103._12_4_ = 0x10;
        auVar103._16_4_ = 0x10;
        auVar103._20_4_ = 0x10;
        auVar103._24_4_ = 0x10;
        auVar103._28_4_ = 0x10;
        local_2a80 = vandps_avx(auVar93,auVar103);
        auVar72 = ZEXT1632(auVar71);
        auVar93 = vcmpps_avx(local_2ac0,auVar72,5);
        auVar76._8_4_ = 0x20;
        auVar76._0_8_ = 0x2000000020;
        auVar76._12_4_ = 0x20;
        auVar76._16_4_ = 0x20;
        auVar76._20_4_ = 0x20;
        auVar76._24_4_ = 0x20;
        auVar76._28_4_ = 0x20;
        auVar104._8_4_ = 0x30;
        auVar104._0_8_ = 0x3000000030;
        auVar104._12_4_ = 0x30;
        auVar104._16_4_ = 0x30;
        auVar104._20_4_ = 0x30;
        auVar104._24_4_ = 0x30;
        auVar104._28_4_ = 0x30;
        local_2a60 = vblendvps_avx(auVar104,auVar76,auVar93);
        auVar93 = vcmpps_avx(local_2aa0,auVar72,5);
        auVar99._8_4_ = 0x40;
        auVar99._0_8_ = 0x4000000040;
        auVar99._12_4_ = 0x40;
        auVar99._16_4_ = 0x40;
        auVar99._20_4_ = 0x40;
        auVar99._24_4_ = 0x40;
        auVar99._28_4_ = 0x40;
        auVar105._8_4_ = 0x50;
        auVar105._0_8_ = 0x5000000050;
        auVar105._12_4_ = 0x50;
        auVar105._16_4_ = 0x50;
        auVar105._20_4_ = 0x50;
        auVar105._24_4_ = 0x50;
        auVar105._28_4_ = 0x50;
        auVar109 = ZEXT3264(auVar105);
        local_2a40 = vblendvps_avx(auVar105,auVar99,auVar93);
        auVar93 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar72);
        local_29c0 = vpmovsxwd_avx2(auVar17);
        local_1e80._8_4_ = 0x7f800000;
        local_1e80._0_8_ = 0x7f8000007f800000;
        local_1e80._12_4_ = 0x7f800000;
        local_1e80._16_4_ = 0x7f800000;
        local_1e80._20_4_ = 0x7f800000;
        local_1e80._24_4_ = 0x7f800000;
        local_1e80._28_4_ = 0x7f800000;
        auVar123 = ZEXT3264(local_1e80);
        local_2a20 = vblendvps_avx(local_1e80,auVar93,local_29c0);
        auVar93 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar72);
        auVar72._8_4_ = 0xff800000;
        auVar72._0_8_ = 0xff800000ff800000;
        auVar72._12_4_ = 0xff800000;
        auVar72._16_4_ = 0xff800000;
        auVar72._20_4_ = 0xff800000;
        auVar72._24_4_ = 0xff800000;
        auVar72._28_4_ = 0xff800000;
        local_2a00 = vblendvps_avx(auVar72,auVar93,local_29c0);
        auVar71 = vpcmpeqd_avx(local_2a00._0_16_,local_2a00._0_16_);
        local_2c60 = vpmovsxwd_avx2(auVar17 ^ auVar71);
        if (context->user == (RTCRayQueryContext *)0x0) {
          local_2d38 = 5;
        }
        else {
          local_2d38 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                              RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
        }
        local_2d08 = ray + 0x100;
        puVar56 = local_2600;
        local_2610 = 0xfffffffffffffff8;
        pauVar54 = (undefined1 (*) [32])local_1e40;
        local_2608 = (local_2d30->root).ptr;
        local_1e60 = local_2a20;
        auVar93 = vpcmpeqd_avx2(in_ZMM14._0_32_,in_ZMM14._0_32_);
        auVar136 = ZEXT3264(auVar93);
        local_2d28 = This;
        local_2d20 = context;
LAB_005acce9:
        pauVar54 = pauVar54 + -1;
        root.ptr = puVar56[-1];
        puVar56 = puVar56 + -1;
        if (root.ptr == 0xfffffffffffffff8) goto LAB_005ad810;
        _local_2d00 = *pauVar54;
        auVar93 = vcmpps_avx(_local_2d00,local_2a00,1);
        if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar93 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar93 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar93 >> 0x7f,0) == '\0') &&
              (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar93 >> 0xbf,0) == '\0') &&
            (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar93[0x1f]) {
LAB_005ad821:
          iVar51 = 2;
        }
        else {
          uVar58 = vmovmskps_avx(auVar93);
          unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),uVar58);
          iVar51 = 0;
          if ((uint)POPCOUNT(uVar58) <= local_2d38) {
            if (unaff_R15 != 0) {
              local_2c80 = auVar126._0_32_;
              local_2d18 = ray;
              do {
                k = 0;
                for (uVar55 = unaff_R15; (uVar55 & 1) == 0;
                    uVar55 = uVar55 >> 1 | 0x8000000000000000) {
                  k = k + 1;
                }
                local_2cc0._0_8_ = k;
                auVar109 = ZEXT1664(auVar109._0_16_);
                auVar115 = ZEXT1664(auVar115._0_16_);
                auVar121 = ZEXT1664(auVar121._0_16_);
                auVar93 = ZEXT1632(auVar136._0_16_);
                bVar59 = occluded1(local_2d28,local_2d30,root,k,&local_2d39,local_2d18,
                                   (TravRayK<8,_true> *)&local_2ba0.field_0,local_2d20);
                if (bVar59) {
                  *(undefined4 *)(local_2c60 + local_2cc0._0_8_ * 4) = 0xffffffff;
                }
                unaff_R15 = unaff_R15 - 1 & unaff_R15;
                auVar126 = ZEXT3264(local_2c80);
                auVar123 = ZEXT3264(CONCAT428(0x7f800000,
                                              CONCAT424(0x7f800000,
                                                        CONCAT420(0x7f800000,
                                                                  CONCAT416(0x7f800000,
                                                                            CONCAT412(0x7f800000,
                                                                                      CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                auVar93 = vpcmpeqd_avx2(auVar93,auVar93);
                auVar136 = ZEXT3264(auVar93);
                ray = local_2d18;
              } while (unaff_R15 != 0);
            }
            auVar93 = auVar136._0_32_ & ~local_2c60;
            iVar51 = 3;
            if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar93 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar93 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar93 >> 0x7f,0) != '\0') ||
                  (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar93 >> 0xbf,0) != '\0') ||
                (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar93[0x1f] < '\0') {
              auVar93._8_4_ = 0xff800000;
              auVar93._0_8_ = 0xff800000ff800000;
              auVar93._12_4_ = 0xff800000;
              auVar93._16_4_ = 0xff800000;
              auVar93._20_4_ = 0xff800000;
              auVar93._24_4_ = 0xff800000;
              auVar93._28_4_ = 0xff800000;
              local_2a00 = vblendvps_avx(local_2a00,auVar93,local_2c60);
              iVar51 = 2;
            }
          }
          if ((uint)local_2d38 < (uint)POPCOUNT(uVar58)) {
            do {
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_005ad810;
                auVar93 = vcmpps_avx(local_2a00,_local_2d00,6);
                if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar93 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar93 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar93 >> 0x7f,0) == '\0') &&
                      (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar93 >> 0xbf,0) == '\0') &&
                    (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar93[0x1f]) goto LAB_005ad821;
                uVar55 = (ulong)((uint)root.ptr & 0xf) - 8;
                auVar93 = local_2c60;
                if (uVar55 == 0) goto LAB_005ad7d7;
                local_29e0 = local_2c60;
                auVar73._0_4_ = auVar136._0_4_ ^ local_2c60._0_4_;
                auVar73._4_4_ = auVar136._4_4_ ^ local_2c60._4_4_;
                auVar73._8_4_ = auVar136._8_4_ ^ local_2c60._8_4_;
                auVar73._12_4_ = auVar136._12_4_ ^ local_2c60._12_4_;
                auVar73._16_4_ = auVar136._16_4_ ^ local_2c60._16_4_;
                auVar73._20_4_ = auVar136._20_4_ ^ local_2c60._20_4_;
                auVar73._24_4_ = auVar136._24_4_ ^ local_2c60._24_4_;
                auVar73._28_4_ = auVar136._28_4_ ^ local_2c60._28_4_;
                unaff_R15 = (root.ptr & 0xfffffffffffffff0) + 0x40;
                uVar52 = 0;
                local_2c80 = auVar126._0_32_;
                goto LAB_005acf2c;
              }
              auVar144 = ZEXT3264(auVar123._0_32_);
              uVar55 = 0;
              uVar52 = 8;
              do {
                uVar57 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + uVar55 * 8);
                if (uVar57 != 8) {
                  uVar58 = *(undefined4 *)(root.ptr + 0x20 + uVar55 * 4);
                  auVar60._4_4_ = uVar58;
                  auVar60._0_4_ = uVar58;
                  auVar60._8_4_ = uVar58;
                  auVar60._12_4_ = uVar58;
                  auVar60._16_4_ = uVar58;
                  auVar60._20_4_ = uVar58;
                  auVar60._24_4_ = uVar58;
                  auVar60._28_4_ = uVar58;
                  auVar45._8_8_ = local_2ba0._8_8_;
                  auVar45._0_8_ = local_2ba0._0_8_;
                  auVar45._16_8_ = local_2ba0._16_8_;
                  auVar45._24_8_ = local_2ba0._24_8_;
                  auVar46._8_8_ = local_2ba0._40_8_;
                  auVar46._0_8_ = local_2ba0._32_8_;
                  auVar46._16_8_ = local_2ba0._48_8_;
                  auVar46._24_8_ = local_2ba0._56_8_;
                  auVar47._8_8_ = local_2ba0._72_8_;
                  auVar47._0_8_ = local_2ba0._64_8_;
                  auVar47._16_8_ = local_2ba0._80_8_;
                  auVar47._24_8_ = local_2ba0._88_8_;
                  auVar93 = vsubps_avx(auVar60,auVar45);
                  auVar110._0_4_ = (float)local_2ae0._0_4_ * auVar93._0_4_;
                  auVar110._4_4_ = (float)local_2ae0._4_4_ * auVar93._4_4_;
                  auVar110._8_4_ = fStack_2ad8 * auVar93._8_4_;
                  auVar110._12_4_ = fStack_2ad4 * auVar93._12_4_;
                  auVar110._16_4_ = fStack_2ad0 * auVar93._16_4_;
                  auVar110._20_4_ = fStack_2acc * auVar93._20_4_;
                  auVar110._28_36_ = auVar109._28_36_;
                  auVar110._24_4_ = fStack_2ac8 * auVar93._24_4_;
                  auVar76 = auVar110._0_32_;
                  auVar109 = ZEXT3264(auVar76);
                  uVar58 = *(undefined4 *)(root.ptr + 0x40 + uVar55 * 4);
                  auVar61._4_4_ = uVar58;
                  auVar61._0_4_ = uVar58;
                  auVar61._8_4_ = uVar58;
                  auVar61._12_4_ = uVar58;
                  auVar61._16_4_ = uVar58;
                  auVar61._20_4_ = uVar58;
                  auVar61._24_4_ = uVar58;
                  auVar61._28_4_ = uVar58;
                  auVar93 = vsubps_avx(auVar61,auVar46);
                  auVar116._0_4_ = local_2ac0._0_4_ * auVar93._0_4_;
                  auVar116._4_4_ = local_2ac0._4_4_ * auVar93._4_4_;
                  auVar116._8_4_ = local_2ac0._8_4_ * auVar93._8_4_;
                  auVar116._12_4_ = local_2ac0._12_4_ * auVar93._12_4_;
                  auVar116._16_4_ = local_2ac0._16_4_ * auVar93._16_4_;
                  auVar116._20_4_ = local_2ac0._20_4_ * auVar93._20_4_;
                  auVar116._28_36_ = auVar115._28_36_;
                  auVar116._24_4_ = local_2ac0._24_4_ * auVar93._24_4_;
                  auVar99 = auVar116._0_32_;
                  auVar115 = ZEXT3264(auVar99);
                  uVar58 = *(undefined4 *)(root.ptr + 0x60 + uVar55 * 4);
                  auVar62._4_4_ = uVar58;
                  auVar62._0_4_ = uVar58;
                  auVar62._8_4_ = uVar58;
                  auVar62._12_4_ = uVar58;
                  auVar62._16_4_ = uVar58;
                  auVar62._20_4_ = uVar58;
                  auVar62._24_4_ = uVar58;
                  auVar62._28_4_ = uVar58;
                  auVar93 = vsubps_avx(auVar62,auVar47);
                  auVar122._0_4_ = local_2aa0._0_4_ * auVar93._0_4_;
                  auVar122._4_4_ = local_2aa0._4_4_ * auVar93._4_4_;
                  auVar122._8_4_ = local_2aa0._8_4_ * auVar93._8_4_;
                  auVar122._12_4_ = local_2aa0._12_4_ * auVar93._12_4_;
                  auVar122._16_4_ = local_2aa0._16_4_ * auVar93._16_4_;
                  auVar122._20_4_ = local_2aa0._20_4_ * auVar93._20_4_;
                  auVar122._28_36_ = auVar121._28_36_;
                  auVar122._24_4_ = local_2aa0._24_4_ * auVar93._24_4_;
                  auVar103 = auVar122._0_32_;
                  auVar121 = ZEXT3264(auVar103);
                  uVar58 = *(undefined4 *)(root.ptr + 0x30 + uVar55 * 4);
                  auVar63._4_4_ = uVar58;
                  auVar63._0_4_ = uVar58;
                  auVar63._8_4_ = uVar58;
                  auVar63._12_4_ = uVar58;
                  auVar63._16_4_ = uVar58;
                  auVar63._20_4_ = uVar58;
                  auVar63._24_4_ = uVar58;
                  auVar63._28_4_ = uVar58;
                  auVar93 = vsubps_avx(auVar63,auVar45);
                  auVar21._4_4_ = (float)local_2ae0._4_4_ * auVar93._4_4_;
                  auVar21._0_4_ = (float)local_2ae0._0_4_ * auVar93._0_4_;
                  auVar21._8_4_ = fStack_2ad8 * auVar93._8_4_;
                  auVar21._12_4_ = fStack_2ad4 * auVar93._12_4_;
                  auVar21._16_4_ = fStack_2ad0 * auVar93._16_4_;
                  auVar21._20_4_ = fStack_2acc * auVar93._20_4_;
                  auVar21._24_4_ = fStack_2ac8 * auVar93._24_4_;
                  auVar21._28_4_ = (int)((ulong)local_2ba0._24_8_ >> 0x20);
                  uVar58 = *(undefined4 *)(root.ptr + 0x50 + uVar55 * 4);
                  auVar64._4_4_ = uVar58;
                  auVar64._0_4_ = uVar58;
                  auVar64._8_4_ = uVar58;
                  auVar64._12_4_ = uVar58;
                  auVar64._16_4_ = uVar58;
                  auVar64._20_4_ = uVar58;
                  auVar64._24_4_ = uVar58;
                  auVar64._28_4_ = uVar58;
                  auVar93 = vsubps_avx(auVar64,auVar46);
                  auVar22._4_4_ = local_2ac0._4_4_ * auVar93._4_4_;
                  auVar22._0_4_ = local_2ac0._0_4_ * auVar93._0_4_;
                  auVar22._8_4_ = local_2ac0._8_4_ * auVar93._8_4_;
                  auVar22._12_4_ = local_2ac0._12_4_ * auVar93._12_4_;
                  auVar22._16_4_ = local_2ac0._16_4_ * auVar93._16_4_;
                  auVar22._20_4_ = local_2ac0._20_4_ * auVar93._20_4_;
                  auVar22._24_4_ = local_2ac0._24_4_ * auVar93._24_4_;
                  auVar22._28_4_ = (int)((ulong)local_2ba0._56_8_ >> 0x20);
                  uVar58 = *(undefined4 *)(root.ptr + 0x70 + uVar55 * 4);
                  auVar65._4_4_ = uVar58;
                  auVar65._0_4_ = uVar58;
                  auVar65._8_4_ = uVar58;
                  auVar65._12_4_ = uVar58;
                  auVar65._16_4_ = uVar58;
                  auVar65._20_4_ = uVar58;
                  auVar65._24_4_ = uVar58;
                  auVar65._28_4_ = uVar58;
                  auVar93 = vsubps_avx(auVar65,auVar47);
                  auVar23._4_4_ = local_2aa0._4_4_ * auVar93._4_4_;
                  auVar23._0_4_ = local_2aa0._0_4_ * auVar93._0_4_;
                  auVar23._8_4_ = local_2aa0._8_4_ * auVar93._8_4_;
                  auVar23._12_4_ = local_2aa0._12_4_ * auVar93._12_4_;
                  auVar23._16_4_ = local_2aa0._16_4_ * auVar93._16_4_;
                  auVar23._20_4_ = local_2aa0._20_4_ * auVar93._20_4_;
                  auVar23._24_4_ = local_2aa0._24_4_ * auVar93._24_4_;
                  auVar23._28_4_ = (int)((ulong)local_2ba0._88_8_ >> 0x20);
                  auVar93 = vminps_avx(auVar76,auVar21);
                  auVar72 = vminps_avx(auVar99,auVar22);
                  auVar93 = vmaxps_avx(auVar93,auVar72);
                  auVar72 = vminps_avx(auVar103,auVar23);
                  auVar93 = vmaxps_avx(auVar93,auVar72);
                  auVar24._4_4_ = auVar93._4_4_ * 0.99999964;
                  auVar24._0_4_ = auVar93._0_4_ * 0.99999964;
                  auVar24._8_4_ = auVar93._8_4_ * 0.99999964;
                  auVar24._12_4_ = auVar93._12_4_ * 0.99999964;
                  auVar24._16_4_ = auVar93._16_4_ * 0.99999964;
                  auVar24._20_4_ = auVar93._20_4_ * 0.99999964;
                  auVar24._24_4_ = auVar93._24_4_ * 0.99999964;
                  auVar24._28_4_ = auVar93._28_4_;
                  auVar93 = vmaxps_avx(auVar76,auVar21);
                  auVar72 = vmaxps_avx(auVar99,auVar22);
                  auVar72 = vminps_avx(auVar93,auVar72);
                  auVar93 = vmaxps_avx(auVar103,auVar23);
                  auVar93 = vminps_avx(auVar72,auVar93);
                  auVar25._4_4_ = auVar93._4_4_ * 1.0000004;
                  auVar25._0_4_ = auVar93._0_4_ * 1.0000004;
                  auVar25._8_4_ = auVar93._8_4_ * 1.0000004;
                  auVar25._12_4_ = auVar93._12_4_ * 1.0000004;
                  auVar25._16_4_ = auVar93._16_4_ * 1.0000004;
                  auVar25._20_4_ = auVar93._20_4_ * 1.0000004;
                  auVar25._24_4_ = auVar93._24_4_ * 1.0000004;
                  auVar25._28_4_ = auVar93._28_4_;
                  auVar93 = vmaxps_avx(auVar24,local_2a20);
                  auVar72 = vminps_avx(auVar25,local_2a00);
                  auVar93 = vcmpps_avx(auVar93,auVar72,2);
                  if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar93 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar93 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar93 >> 0x7f,0) != '\0') ||
                        (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar93 >> 0xbf,0) != '\0') ||
                      (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar93[0x1f] < '\0') {
                    auVar93 = vblendvps_avx(auVar123._0_32_,auVar24,auVar93);
                    if (uVar52 != 8) {
                      *puVar56 = uVar52;
                      puVar56 = puVar56 + 1;
                      *pauVar54 = auVar144._0_32_;
                      pauVar54 = pauVar54 + 1;
                    }
                    auVar144 = ZEXT3264(auVar93);
                    uVar52 = uVar57;
                  }
                }
                _local_2d00 = auVar144._0_32_;
              } while ((uVar57 != 8) && (bVar59 = uVar55 < 3, uVar55 = uVar55 + 1, bVar59));
              iVar51 = 0;
              if (uVar52 == 8) {
LAB_005acec8:
                bVar59 = false;
                iVar51 = 4;
              }
              else {
                auVar93 = vcmpps_avx(local_2a00,_local_2d00,6);
                uVar58 = vmovmskps_avx(auVar93);
                bVar59 = true;
                if ((uint)POPCOUNT(uVar58) <= (uint)local_2d38) {
                  *puVar56 = uVar52;
                  puVar56 = puVar56 + 1;
                  *pauVar54 = _local_2d00;
                  pauVar54 = pauVar54 + 1;
                  goto LAB_005acec8;
                }
              }
              root.ptr = uVar52;
            } while (bVar59);
          }
        }
        goto LAB_005ad813;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
  while( true ) {
    uVar52 = local_2c98 + 1;
    unaff_R15 = local_2d10 + 0x50;
    if (uVar55 <= uVar52) break;
LAB_005acf2c:
    local_2c88 = uVar52 * 0x50 + (root.ptr & 0xfffffffffffffff0);
    local_2c90 = local_2d20->scene;
    auVar115 = ZEXT3264(auVar73);
    uVar57 = 0;
    local_2d10 = unaff_R15;
    local_2c98 = uVar52;
    local_2c00 = auVar73;
    while (*(int *)(local_2d10 + uVar57 * 4) != -1) {
      pfVar5 = (local_2c90->vertices).items[*(uint *)((local_2d10 - 0x10) + uVar57 * 4)];
      uVar52 = (ulong)*(uint *)((local_2d10 - 0x40) + uVar57 * 4);
      uVar53 = (ulong)*(uint *)((local_2d10 - 0x30) + uVar57 * 4);
      fVar2 = pfVar5[uVar52];
      auVar66._4_4_ = fVar2;
      auVar66._0_4_ = fVar2;
      auVar66._8_4_ = fVar2;
      auVar66._12_4_ = fVar2;
      auVar66._16_4_ = fVar2;
      auVar66._20_4_ = fVar2;
      auVar66._24_4_ = fVar2;
      auVar66._28_4_ = fVar2;
      fVar2 = pfVar5[uVar52 + 1];
      auVar74._4_4_ = fVar2;
      auVar74._0_4_ = fVar2;
      auVar74._8_4_ = fVar2;
      auVar74._12_4_ = fVar2;
      auVar74._16_4_ = fVar2;
      auVar74._20_4_ = fVar2;
      auVar74._24_4_ = fVar2;
      auVar74._28_4_ = fVar2;
      fVar2 = pfVar5[uVar52 + 2];
      auVar88._4_4_ = fVar2;
      auVar88._0_4_ = fVar2;
      auVar88._8_4_ = fVar2;
      auVar88._12_4_ = fVar2;
      auVar88._16_4_ = fVar2;
      auVar88._20_4_ = fVar2;
      auVar88._24_4_ = fVar2;
      auVar88._28_4_ = fVar2;
      fVar2 = pfVar5[uVar53];
      auVar95._4_4_ = fVar2;
      auVar95._0_4_ = fVar2;
      auVar95._8_4_ = fVar2;
      auVar95._12_4_ = fVar2;
      auVar95._16_4_ = fVar2;
      auVar95._20_4_ = fVar2;
      auVar95._24_4_ = fVar2;
      auVar95._28_4_ = fVar2;
      fVar2 = pfVar5[uVar53 + 1];
      auVar100._4_4_ = fVar2;
      auVar100._0_4_ = fVar2;
      auVar100._8_4_ = fVar2;
      auVar100._12_4_ = fVar2;
      auVar100._16_4_ = fVar2;
      auVar100._20_4_ = fVar2;
      auVar100._24_4_ = fVar2;
      auVar100._28_4_ = fVar2;
      fVar2 = pfVar5[uVar53 + 2];
      auVar106._4_4_ = fVar2;
      auVar106._0_4_ = fVar2;
      auVar106._8_4_ = fVar2;
      auVar106._12_4_ = fVar2;
      auVar106._16_4_ = fVar2;
      auVar106._20_4_ = fVar2;
      auVar106._24_4_ = fVar2;
      auVar106._28_4_ = fVar2;
      uVar52 = (ulong)*(uint *)((local_2d10 - 0x20) + uVar57 * 4);
      fVar2 = pfVar5[uVar52];
      auVar111._4_4_ = fVar2;
      auVar111._0_4_ = fVar2;
      auVar111._8_4_ = fVar2;
      auVar111._12_4_ = fVar2;
      auVar111._16_4_ = fVar2;
      auVar111._20_4_ = fVar2;
      auVar111._24_4_ = fVar2;
      auVar111._28_4_ = fVar2;
      auVar99 = auVar115._0_32_;
      fVar2 = pfVar5[uVar52 + 1];
      auVar135._4_4_ = fVar2;
      auVar135._0_4_ = fVar2;
      auVar135._8_4_ = fVar2;
      auVar135._12_4_ = fVar2;
      auVar135._16_4_ = fVar2;
      auVar135._20_4_ = fVar2;
      auVar135._24_4_ = fVar2;
      auVar135._28_4_ = fVar2;
      fVar2 = pfVar5[uVar52 + 2];
      auVar117._4_4_ = fVar2;
      auVar117._0_4_ = fVar2;
      auVar117._8_4_ = fVar2;
      auVar117._12_4_ = fVar2;
      auVar117._16_4_ = fVar2;
      auVar117._20_4_ = fVar2;
      auVar117._24_4_ = fVar2;
      auVar117._28_4_ = fVar2;
      local_2bb0 = *(undefined8 *)(local_2c88 + 0x30);
      uStack_2ba8 = *(undefined8 *)(local_2c88 + 0x38);
      local_2bc0 = *(undefined8 *)(local_2c88 + 0x40);
      uStack_2bb8 = *(undefined8 *)(local_2c88 + 0x48);
      auVar93 = *(undefined1 (*) [32])ray;
      auVar72 = *(undefined1 (*) [32])(ray + 0x20);
      auVar76 = *(undefined1 (*) [32])(ray + 0x40);
      local_2780 = vsubps_avx(auVar66,auVar93);
      local_27a0 = vsubps_avx(auVar74,auVar72);
      local_27c0 = vsubps_avx(auVar88,auVar76);
      auVar103 = vsubps_avx(auVar95,auVar93);
      auVar104 = vsubps_avx(auVar100,auVar72);
      auVar105 = vsubps_avx(auVar106,auVar76);
      auVar77 = vsubps_avx(auVar111,auVar93);
      auVar107 = vsubps_avx(auVar135,auVar72);
      auVar76 = vsubps_avx(auVar117,auVar76);
      local_27e0 = vsubps_avx(auVar77,local_2780);
      local_2820 = vsubps_avx(auVar107,local_27a0);
      local_2800 = vsubps_avx(auVar76,local_27c0);
      auVar96._0_4_ = auVar77._0_4_ + local_2780._0_4_;
      auVar96._4_4_ = auVar77._4_4_ + local_2780._4_4_;
      auVar96._8_4_ = auVar77._8_4_ + local_2780._8_4_;
      auVar96._12_4_ = auVar77._12_4_ + local_2780._12_4_;
      auVar96._16_4_ = auVar77._16_4_ + local_2780._16_4_;
      auVar96._20_4_ = auVar77._20_4_ + local_2780._20_4_;
      auVar96._24_4_ = auVar77._24_4_ + local_2780._24_4_;
      auVar96._28_4_ = auVar77._28_4_ + local_2780._28_4_;
      auVar112._0_4_ = local_27a0._0_4_ + auVar107._0_4_;
      auVar112._4_4_ = local_27a0._4_4_ + auVar107._4_4_;
      auVar112._8_4_ = local_27a0._8_4_ + auVar107._8_4_;
      auVar112._12_4_ = local_27a0._12_4_ + auVar107._12_4_;
      auVar112._16_4_ = local_27a0._16_4_ + auVar107._16_4_;
      auVar112._20_4_ = local_27a0._20_4_ + auVar107._20_4_;
      auVar112._24_4_ = local_27a0._24_4_ + auVar107._24_4_;
      auVar112._28_4_ = local_27a0._28_4_ + auVar107._28_4_;
      fVar2 = local_27c0._0_4_;
      auVar118._0_4_ = auVar76._0_4_ + fVar2;
      fVar8 = local_27c0._4_4_;
      auVar118._4_4_ = auVar76._4_4_ + fVar8;
      fVar9 = local_27c0._8_4_;
      auVar118._8_4_ = auVar76._8_4_ + fVar9;
      fVar10 = local_27c0._12_4_;
      auVar118._12_4_ = auVar76._12_4_ + fVar10;
      fVar11 = local_27c0._16_4_;
      auVar118._16_4_ = auVar76._16_4_ + fVar11;
      fVar12 = local_27c0._20_4_;
      auVar118._20_4_ = auVar76._20_4_ + fVar12;
      fVar13 = local_27c0._24_4_;
      auVar118._24_4_ = auVar76._24_4_ + fVar13;
      fVar94 = auVar76._28_4_;
      auVar118._28_4_ = fVar94 + local_27c0._28_4_;
      auVar98._4_4_ = local_2800._4_4_ * auVar112._4_4_;
      auVar98._0_4_ = local_2800._0_4_ * auVar112._0_4_;
      auVar98._8_4_ = local_2800._8_4_ * auVar112._8_4_;
      auVar98._12_4_ = local_2800._12_4_ * auVar112._12_4_;
      auVar98._16_4_ = local_2800._16_4_ * auVar112._16_4_;
      auVar98._20_4_ = local_2800._20_4_ * auVar112._20_4_;
      auVar98._24_4_ = local_2800._24_4_ * auVar112._24_4_;
      auVar98._28_4_ = auVar72._28_4_;
      auVar17 = vfmsub231ps_fma(auVar98,local_2820,auVar118);
      auVar26._4_4_ = auVar118._4_4_ * local_27e0._4_4_;
      auVar26._0_4_ = auVar118._0_4_ * local_27e0._0_4_;
      auVar26._8_4_ = auVar118._8_4_ * local_27e0._8_4_;
      auVar26._12_4_ = auVar118._12_4_ * local_27e0._12_4_;
      auVar26._16_4_ = auVar118._16_4_ * local_27e0._16_4_;
      auVar26._20_4_ = auVar118._20_4_ * local_27e0._20_4_;
      auVar26._24_4_ = auVar118._24_4_ * local_27e0._24_4_;
      auVar26._28_4_ = auVar93._28_4_;
      auVar71 = vfmsub231ps_fma(auVar26,local_2800,auVar96);
      auVar27._4_4_ = local_2820._4_4_ * auVar96._4_4_;
      auVar27._0_4_ = local_2820._0_4_ * auVar96._0_4_;
      auVar27._8_4_ = local_2820._8_4_ * auVar96._8_4_;
      auVar27._12_4_ = local_2820._12_4_ * auVar96._12_4_;
      auVar27._16_4_ = local_2820._16_4_ * auVar96._16_4_;
      auVar27._20_4_ = local_2820._20_4_ * auVar96._20_4_;
      auVar27._24_4_ = local_2820._24_4_ * auVar96._24_4_;
      auVar27._28_4_ = auVar96._28_4_;
      auVar18 = vfmsub231ps_fma(auVar27,local_27e0,auVar112);
      pRVar1 = ray + 0xc0;
      fVar69 = *(float *)pRVar1;
      fVar79 = *(float *)(ray + 0xc4);
      fVar81 = *(float *)(ray + 200);
      fVar83 = *(float *)(ray + 0xcc);
      fVar85 = *(float *)(ray + 0xd0);
      fVar86 = *(float *)(ray + 0xd4);
      fVar87 = *(float *)(ray + 0xd8);
      auVar49 = *(undefined1 (*) [28])pRVar1;
      auVar97._0_4_ = fVar69 * auVar18._0_4_;
      auVar97._4_4_ = fVar79 * auVar18._4_4_;
      auVar97._8_4_ = fVar81 * auVar18._8_4_;
      auVar97._12_4_ = fVar83 * auVar18._12_4_;
      auVar97._16_4_ = fVar85 * 0.0;
      auVar97._20_4_ = fVar86 * 0.0;
      auVar97._24_4_ = fVar87 * 0.0;
      auVar97._28_4_ = 0;
      local_2760 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar71 = vfmadd231ps_fma(auVar97,local_2760,ZEXT1632(auVar71));
      auVar93 = *(undefined1 (*) [32])(ray + 0x80);
      auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),auVar93,ZEXT1632(auVar17));
      local_2840 = vsubps_avx(local_27a0,auVar104);
      auVar125 = vsubps_avx(local_27c0,auVar105);
      auVar113._0_4_ = local_27a0._0_4_ + auVar104._0_4_;
      auVar113._4_4_ = local_27a0._4_4_ + auVar104._4_4_;
      auVar113._8_4_ = local_27a0._8_4_ + auVar104._8_4_;
      auVar113._12_4_ = local_27a0._12_4_ + auVar104._12_4_;
      auVar113._16_4_ = local_27a0._16_4_ + auVar104._16_4_;
      auVar113._20_4_ = local_27a0._20_4_ + auVar104._20_4_;
      auVar113._24_4_ = local_27a0._24_4_ + auVar104._24_4_;
      auVar113._28_4_ = local_27a0._28_4_ + auVar104._28_4_;
      auVar143._0_4_ = fVar2 + auVar105._0_4_;
      auVar143._4_4_ = fVar8 + auVar105._4_4_;
      auVar143._8_4_ = fVar9 + auVar105._8_4_;
      auVar143._12_4_ = fVar10 + auVar105._12_4_;
      auVar143._16_4_ = fVar11 + auVar105._16_4_;
      auVar143._20_4_ = fVar12 + auVar105._20_4_;
      auVar143._24_4_ = fVar13 + auVar105._24_4_;
      auVar143._28_4_ = local_27c0._28_4_ + auVar105._28_4_;
      fVar134 = auVar125._0_4_;
      fVar137 = auVar125._4_4_;
      auVar28._4_4_ = fVar137 * auVar113._4_4_;
      auVar28._0_4_ = fVar134 * auVar113._0_4_;
      fVar138 = auVar125._8_4_;
      auVar28._8_4_ = fVar138 * auVar113._8_4_;
      fVar139 = auVar125._12_4_;
      auVar28._12_4_ = fVar139 * auVar113._12_4_;
      fVar140 = auVar125._16_4_;
      auVar28._16_4_ = fVar140 * auVar113._16_4_;
      fVar141 = auVar125._20_4_;
      auVar28._20_4_ = fVar141 * auVar113._20_4_;
      fVar142 = auVar125._24_4_;
      auVar28._24_4_ = fVar142 * auVar113._24_4_;
      auVar28._28_4_ = local_27e0._28_4_;
      auVar18 = vfmsub231ps_fma(auVar28,local_2840,auVar143);
      auVar133 = vsubps_avx(local_2780,auVar103);
      fVar70 = auVar133._0_4_;
      fVar80 = auVar133._4_4_;
      auVar29._4_4_ = auVar143._4_4_ * fVar80;
      auVar29._0_4_ = auVar143._0_4_ * fVar70;
      fVar82 = auVar133._8_4_;
      auVar29._8_4_ = auVar143._8_4_ * fVar82;
      fVar84 = auVar133._12_4_;
      auVar29._12_4_ = auVar143._12_4_ * fVar84;
      fVar14 = auVar133._16_4_;
      auVar29._16_4_ = auVar143._16_4_ * fVar14;
      fVar15 = auVar133._20_4_;
      auVar29._20_4_ = auVar143._20_4_ * fVar15;
      fVar16 = auVar133._24_4_;
      auVar29._24_4_ = auVar143._24_4_ * fVar16;
      auVar29._28_4_ = auVar143._28_4_;
      auVar114._0_4_ = auVar103._0_4_ + local_2780._0_4_;
      auVar114._4_4_ = auVar103._4_4_ + local_2780._4_4_;
      auVar114._8_4_ = auVar103._8_4_ + local_2780._8_4_;
      auVar114._12_4_ = auVar103._12_4_ + local_2780._12_4_;
      auVar114._16_4_ = auVar103._16_4_ + local_2780._16_4_;
      auVar114._20_4_ = auVar103._20_4_ + local_2780._20_4_;
      auVar114._24_4_ = auVar103._24_4_ + local_2780._24_4_;
      auVar114._28_4_ = auVar103._28_4_ + local_2780._28_4_;
      auVar17 = vfmsub231ps_fma(auVar29,auVar125,auVar114);
      fVar124 = local_2840._0_4_;
      fVar127 = local_2840._4_4_;
      auVar30._4_4_ = fVar127 * auVar114._4_4_;
      auVar30._0_4_ = fVar124 * auVar114._0_4_;
      fVar128 = local_2840._8_4_;
      auVar30._8_4_ = fVar128 * auVar114._8_4_;
      fVar129 = local_2840._12_4_;
      auVar30._12_4_ = fVar129 * auVar114._12_4_;
      fVar130 = local_2840._16_4_;
      auVar30._16_4_ = fVar130 * auVar114._16_4_;
      fVar131 = local_2840._20_4_;
      auVar30._20_4_ = fVar131 * auVar114._20_4_;
      fVar132 = local_2840._24_4_;
      auVar30._24_4_ = fVar132 * auVar114._24_4_;
      auVar30._28_4_ = auVar114._28_4_;
      auVar19 = vfmsub231ps_fma(auVar30,auVar133,auVar113);
      auVar31._4_4_ = fVar79 * auVar19._4_4_;
      auVar31._0_4_ = fVar69 * auVar19._0_4_;
      auVar31._8_4_ = fVar81 * auVar19._8_4_;
      auVar31._12_4_ = fVar83 * auVar19._12_4_;
      auVar31._16_4_ = fVar85 * 0.0;
      auVar31._20_4_ = fVar86 * 0.0;
      auVar31._24_4_ = fVar87 * 0.0;
      auVar31._28_4_ = auVar113._28_4_;
      auVar17 = vfmadd231ps_fma(auVar31,local_2760,ZEXT1632(auVar17));
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar93,ZEXT1632(auVar18));
      auVar126 = ZEXT3264(local_2c80);
      auVar73 = vsubps_avx(auVar103,auVar77);
      auVar75._0_4_ = auVar103._0_4_ + auVar77._0_4_;
      auVar75._4_4_ = auVar103._4_4_ + auVar77._4_4_;
      auVar75._8_4_ = auVar103._8_4_ + auVar77._8_4_;
      auVar75._12_4_ = auVar103._12_4_ + auVar77._12_4_;
      auVar75._16_4_ = auVar103._16_4_ + auVar77._16_4_;
      auVar75._20_4_ = auVar103._20_4_ + auVar77._20_4_;
      auVar75._24_4_ = auVar103._24_4_ + auVar77._24_4_;
      auVar75._28_4_ = auVar103._28_4_ + auVar77._28_4_;
      auVar77 = vsubps_avx(auVar104,auVar107);
      auVar67._0_4_ = auVar104._0_4_ + auVar107._0_4_;
      auVar67._4_4_ = auVar104._4_4_ + auVar107._4_4_;
      auVar67._8_4_ = auVar104._8_4_ + auVar107._8_4_;
      auVar67._12_4_ = auVar104._12_4_ + auVar107._12_4_;
      auVar67._16_4_ = auVar104._16_4_ + auVar107._16_4_;
      auVar67._20_4_ = auVar104._20_4_ + auVar107._20_4_;
      auVar67._24_4_ = auVar104._24_4_ + auVar107._24_4_;
      auVar67._28_4_ = auVar104._28_4_ + auVar107._28_4_;
      auVar120 = vsubps_avx(auVar105,auVar76);
      auVar89._0_4_ = auVar105._0_4_ + auVar76._0_4_;
      auVar89._4_4_ = auVar105._4_4_ + auVar76._4_4_;
      auVar89._8_4_ = auVar105._8_4_ + auVar76._8_4_;
      auVar89._12_4_ = auVar105._12_4_ + auVar76._12_4_;
      auVar89._16_4_ = auVar105._16_4_ + auVar76._16_4_;
      auVar89._20_4_ = auVar105._20_4_ + auVar76._20_4_;
      auVar89._24_4_ = auVar105._24_4_ + auVar76._24_4_;
      auVar89._28_4_ = auVar105._28_4_ + fVar94;
      auVar32._4_4_ = auVar120._4_4_ * auVar67._4_4_;
      auVar32._0_4_ = auVar120._0_4_ * auVar67._0_4_;
      auVar32._8_4_ = auVar120._8_4_ * auVar67._8_4_;
      auVar32._12_4_ = auVar120._12_4_ * auVar67._12_4_;
      auVar32._16_4_ = auVar120._16_4_ * auVar67._16_4_;
      auVar32._20_4_ = auVar120._20_4_ * auVar67._20_4_;
      auVar32._24_4_ = auVar120._24_4_ * auVar67._24_4_;
      auVar32._28_4_ = fVar94;
      auVar19 = vfmsub231ps_fma(auVar32,auVar77,auVar89);
      auVar33._4_4_ = auVar73._4_4_ * auVar89._4_4_;
      auVar33._0_4_ = auVar73._0_4_ * auVar89._0_4_;
      auVar33._8_4_ = auVar73._8_4_ * auVar89._8_4_;
      auVar33._12_4_ = auVar73._12_4_ * auVar89._12_4_;
      auVar33._16_4_ = auVar73._16_4_ * auVar89._16_4_;
      auVar33._20_4_ = auVar73._20_4_ * auVar89._20_4_;
      auVar33._24_4_ = auVar73._24_4_ * auVar89._24_4_;
      auVar33._28_4_ = auVar89._28_4_;
      auVar18 = vfmsub231ps_fma(auVar33,auVar120,auVar75);
      auVar34._4_4_ = auVar77._4_4_ * auVar75._4_4_;
      auVar34._0_4_ = auVar77._0_4_ * auVar75._0_4_;
      auVar34._8_4_ = auVar77._8_4_ * auVar75._8_4_;
      auVar34._12_4_ = auVar77._12_4_ * auVar75._12_4_;
      auVar34._16_4_ = auVar77._16_4_ * auVar75._16_4_;
      auVar34._20_4_ = auVar77._20_4_ * auVar75._20_4_;
      auVar34._24_4_ = auVar77._24_4_ * auVar75._24_4_;
      auVar34._28_4_ = auVar75._28_4_;
      auVar20 = vfmsub231ps_fma(auVar34,auVar73,auVar67);
      _auStack_2cf8 = SUB3224(*(undefined1 (*) [32])pRVar1,8);
      auVar50 = _auStack_2cf8;
      auVar35._4_4_ = fVar79 * auVar20._4_4_;
      auVar35._0_4_ = fVar69 * auVar20._0_4_;
      auVar35._8_4_ = fVar81 * auVar20._8_4_;
      auVar35._12_4_ = fVar83 * auVar20._12_4_;
      auVar35._16_4_ = fVar85 * 0.0;
      auVar35._20_4_ = fVar86 * 0.0;
      auVar35._24_4_ = fVar87 * 0.0;
      auVar35._28_4_ = auVar67._28_4_;
      auVar18 = vfmadd231ps_fma(auVar35,local_2760,ZEXT1632(auVar18));
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar93,ZEXT1632(auVar19));
      auVar107 = ZEXT1632(CONCAT412(auVar18._12_4_ + auVar71._12_4_ + auVar17._12_4_,
                                    CONCAT48(auVar18._8_4_ + auVar71._8_4_ + auVar17._8_4_,
                                             CONCAT44(auVar18._4_4_ + auVar71._4_4_ + auVar17._4_4_,
                                                      auVar18._0_4_ + auVar71._0_4_ + auVar17._0_4_)
                                            )));
      auVar72 = vandps_avx(local_2c80,auVar107);
      fVar69 = auVar72._0_4_ * 1.1920929e-07;
      fVar79 = auVar72._4_4_ * 1.1920929e-07;
      auVar36._4_4_ = fVar79;
      auVar36._0_4_ = fVar69;
      fVar81 = auVar72._8_4_ * 1.1920929e-07;
      auVar36._8_4_ = fVar81;
      fVar83 = auVar72._12_4_ * 1.1920929e-07;
      auVar36._12_4_ = fVar83;
      fVar85 = auVar72._16_4_ * 1.1920929e-07;
      auVar36._16_4_ = fVar85;
      fVar86 = auVar72._20_4_ * 1.1920929e-07;
      auVar36._20_4_ = fVar86;
      fVar87 = auVar72._24_4_ * 1.1920929e-07;
      auVar36._24_4_ = fVar87;
      auVar36._28_4_ = auVar72._28_4_;
      auVar98 = ZEXT1632(auVar71);
      auVar76 = vminps_avx(auVar98,ZEXT1632(auVar17));
      auVar76 = vminps_avx(auVar76,ZEXT1632(auVar18));
      auVar101._0_8_ = CONCAT44(fVar79,fVar69) ^ 0x8000000080000000;
      auVar101._8_4_ = -fVar81;
      auVar101._12_4_ = -fVar83;
      auVar101._16_4_ = -fVar85;
      auVar101._20_4_ = -fVar86;
      auVar101._24_4_ = -fVar87;
      auVar101._28_4_ = auVar72._28_4_ ^ 0x80000000;
      auVar76 = vcmpps_avx(auVar76,auVar101,5);
      auVar103 = vmaxps_avx(auVar98,ZEXT1632(auVar17));
      auVar72 = vmaxps_avx(auVar103,ZEXT1632(auVar18));
      auVar72 = vcmpps_avx(auVar72,auVar36,2);
      auVar104 = vorps_avx(auVar76,auVar72);
      auVar105 = auVar99 & auVar104;
      auVar72 = vandps_avx(auVar104,auVar99);
      if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar105 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar105 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar105 >> 0x7f,0) == '\0') &&
            (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar105 >> 0xbf,0) == '\0') &&
          (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar105[0x1f]) {
        auVar76 = vpcmpeqd_avx2(auVar125,auVar125);
      }
      else {
        local_28c0 = auVar107;
        local_2860 = auVar72;
        local_2880 = 0x80000000;
        uStack_287c = 0x80000000;
        uStack_2878 = 0x80000000;
        uStack_2874 = 0x80000000;
        uStack_2870 = 0x80000000;
        uStack_286c = 0x80000000;
        uStack_2868 = 0x80000000;
        uStack_2864 = 0x80000000;
        auVar37._4_4_ = fVar127 * local_2800._4_4_;
        auVar37._0_4_ = fVar124 * local_2800._0_4_;
        auVar37._8_4_ = fVar128 * local_2800._8_4_;
        auVar37._12_4_ = fVar129 * local_2800._12_4_;
        auVar37._16_4_ = fVar130 * local_2800._16_4_;
        auVar37._20_4_ = fVar131 * local_2800._20_4_;
        auVar37._24_4_ = fVar132 * local_2800._24_4_;
        auVar37._28_4_ = auVar104._28_4_;
        local_28a0 = fVar70 * local_2820._0_4_;
        fStack_289c = fVar80 * local_2820._4_4_;
        fStack_2898 = fVar82 * local_2820._8_4_;
        fStack_2894 = fVar84 * local_2820._12_4_;
        fStack_2890 = fVar14 * local_2820._16_4_;
        fStack_288c = fVar15 * local_2820._20_4_;
        uStack_2884 = auVar76._28_4_;
        fStack_2888 = fVar16 * local_2820._24_4_;
        auVar71 = vfmsub213ps_fma(local_2820,auVar125,auVar37);
        auVar38._4_4_ = auVar77._4_4_ * fVar137;
        auVar38._0_4_ = auVar77._0_4_ * fVar134;
        auVar38._8_4_ = auVar77._8_4_ * fVar138;
        auVar38._12_4_ = auVar77._12_4_ * fVar139;
        auVar38._16_4_ = auVar77._16_4_ * fVar140;
        auVar38._20_4_ = auVar77._20_4_ * fVar141;
        auVar38._24_4_ = auVar77._24_4_ * fVar142;
        auVar38._28_4_ = uStack_2884;
        auVar39._4_4_ = fVar80 * auVar120._4_4_;
        auVar39._0_4_ = fVar70 * auVar120._0_4_;
        auVar39._8_4_ = fVar82 * auVar120._8_4_;
        auVar39._12_4_ = fVar84 * auVar120._12_4_;
        auVar39._16_4_ = fVar14 * auVar120._16_4_;
        auVar39._20_4_ = fVar15 * auVar120._20_4_;
        auVar39._24_4_ = fVar16 * auVar120._24_4_;
        auVar39._28_4_ = auVar103._28_4_;
        auVar18 = vfmsub213ps_fma(auVar120,local_2840,auVar38);
        auVar76 = vandps_avx(local_2c80,auVar37);
        auVar103 = vandps_avx(local_2c80,auVar38);
        auVar76 = vcmpps_avx(auVar76,auVar103,1);
        auVar104 = vblendvps_avx(ZEXT1632(auVar18),ZEXT1632(auVar71),auVar76);
        auVar108._0_4_ = auVar73._0_4_ * fVar124;
        auVar108._4_4_ = auVar73._4_4_ * fVar127;
        auVar108._8_4_ = auVar73._8_4_ * fVar128;
        auVar108._12_4_ = auVar73._12_4_ * fVar129;
        auVar108._16_4_ = auVar73._16_4_ * fVar130;
        auVar108._20_4_ = auVar73._20_4_ * fVar131;
        auVar108._24_4_ = auVar73._24_4_ * fVar132;
        auVar108._28_4_ = 0;
        auVar71 = vfmsub213ps_fma(auVar73,auVar125,auVar39);
        auVar40._4_4_ = fVar137 * local_27e0._4_4_;
        auVar40._0_4_ = fVar134 * local_27e0._0_4_;
        auVar40._8_4_ = fVar138 * local_27e0._8_4_;
        auVar40._12_4_ = fVar139 * local_27e0._12_4_;
        auVar40._16_4_ = fVar140 * local_27e0._16_4_;
        auVar40._20_4_ = fVar141 * local_27e0._20_4_;
        auVar40._24_4_ = fVar142 * local_27e0._24_4_;
        auVar40._28_4_ = auVar103._28_4_;
        auVar18 = vfmsub213ps_fma(local_2800,auVar133,auVar40);
        auVar76 = vandps_avx(local_2c80,auVar40);
        auVar103 = vandps_avx(local_2c80,auVar39);
        auVar76 = vcmpps_avx(auVar76,auVar103,1);
        auVar105 = vblendvps_avx(ZEXT1632(auVar71),ZEXT1632(auVar18),auVar76);
        auVar48._4_4_ = fStack_289c;
        auVar48._0_4_ = local_28a0;
        auVar48._8_4_ = fStack_2898;
        auVar48._12_4_ = fStack_2894;
        auVar48._16_4_ = fStack_2890;
        auVar48._20_4_ = fStack_288c;
        auVar48._24_4_ = fStack_2888;
        auVar48._28_4_ = uStack_2884;
        auVar71 = vfmsub213ps_fma(local_27e0,local_2840,auVar48);
        auVar18 = vfmsub213ps_fma(auVar77,auVar133,auVar108);
        auVar76 = vandps_avx(local_2c80,auVar48);
        auVar103 = vandps_avx(local_2c80,auVar108);
        auVar76 = vcmpps_avx(auVar76,auVar103,1);
        auVar103 = vblendvps_avx(ZEXT1632(auVar18),ZEXT1632(auVar71),auVar76);
        local_2d00._0_4_ = auVar49._0_4_;
        local_2d00._4_4_ = auVar49._4_4_;
        auStack_2cf8._0_4_ = auVar49._8_4_;
        auStack_2cf8._4_4_ = auVar49._12_4_;
        fStack_2cf0 = auVar49._16_4_;
        fStack_2cec = auVar49._20_4_;
        fStack_2ce8 = auVar49._24_4_;
        auVar41._4_4_ = auVar103._4_4_ * (float)local_2d00._4_4_;
        auVar41._0_4_ = auVar103._0_4_ * (float)local_2d00._0_4_;
        auVar41._8_4_ = auVar103._8_4_ * (float)auStack_2cf8._0_4_;
        auVar41._12_4_ = auVar103._12_4_ * (float)auStack_2cf8._4_4_;
        auVar41._16_4_ = auVar103._16_4_ * fStack_2cf0;
        auVar41._20_4_ = auVar103._20_4_ * fStack_2cec;
        auVar41._24_4_ = auVar103._24_4_ * fStack_2ce8;
        auVar41._28_4_ = auVar76._28_4_;
        auVar71 = vfmadd213ps_fma(local_2760,auVar105,auVar41);
        auVar71 = vfmadd213ps_fma(auVar93,auVar104,ZEXT1632(auVar71));
        fVar70 = auVar71._0_4_ + auVar71._0_4_;
        fVar80 = auVar71._4_4_ + auVar71._4_4_;
        fVar82 = auVar71._8_4_ + auVar71._8_4_;
        fVar84 = auVar71._12_4_ + auVar71._12_4_;
        auVar73 = ZEXT1632(CONCAT412(fVar84,CONCAT48(fVar82,CONCAT44(fVar80,fVar70))));
        auVar42._4_4_ = auVar103._4_4_ * fVar8;
        auVar42._0_4_ = auVar103._0_4_ * fVar2;
        auVar42._8_4_ = auVar103._8_4_ * fVar9;
        auVar42._12_4_ = auVar103._12_4_ * fVar10;
        auVar42._16_4_ = auVar103._16_4_ * fVar11;
        auVar42._20_4_ = auVar103._20_4_ * fVar12;
        auVar42._24_4_ = auVar103._24_4_ * fVar13;
        auVar42._28_4_ = 0;
        auVar71 = vfmadd213ps_fma(local_27a0,auVar105,auVar42);
        auVar18 = vfmadd213ps_fma(local_2780,auVar104,ZEXT1632(auVar71));
        auVar76 = vrcpps_avx(auVar73);
        auVar120._8_4_ = 0x3f800000;
        auVar120._0_8_ = &DAT_3f8000003f800000;
        auVar120._12_4_ = 0x3f800000;
        auVar120._16_4_ = 0x3f800000;
        auVar120._20_4_ = 0x3f800000;
        auVar120._24_4_ = 0x3f800000;
        auVar120._28_4_ = 0x3f800000;
        auVar71 = vfnmadd213ps_fma(auVar76,auVar73,auVar120);
        auVar71 = vfmadd132ps_fma(ZEXT1632(auVar71),auVar76,auVar76);
        auVar133 = ZEXT1632(CONCAT412(auVar71._12_4_ * (auVar18._12_4_ + auVar18._12_4_),
                                      CONCAT48(auVar71._8_4_ * (auVar18._8_4_ + auVar18._8_4_),
                                               CONCAT44(auVar71._4_4_ *
                                                        (auVar18._4_4_ + auVar18._4_4_),
                                                        auVar71._0_4_ *
                                                        (auVar18._0_4_ + auVar18._0_4_)))));
        auVar76 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar133,2);
        auVar77 = vcmpps_avx(auVar133,*(undefined1 (*) [32])(ray + 0x100),2);
        auVar76 = vandps_avx(auVar77,auVar76);
        auVar119._0_8_ = CONCAT44(fVar80,fVar70) ^ 0x8000000080000000;
        auVar119._8_4_ = -fVar82;
        auVar119._12_4_ = -fVar84;
        auVar119._16_4_ = 0x80000000;
        auVar119._20_4_ = 0x80000000;
        auVar119._24_4_ = 0x80000000;
        auVar119._28_4_ = 0x80000000;
        auVar77 = vcmpps_avx(auVar119,auVar73,4);
        auVar76 = vandps_avx(auVar77,auVar76);
        auVar76 = vpslld_avx2(auVar76,0x1f);
        auVar77 = vpsrad_avx2(auVar76,0x1f);
        auVar76 = auVar72 & auVar77;
        auVar72 = vandps_avx(auVar77,auVar72);
        if ((((((((auVar76 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar76 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar76 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar76 >> 0x7f,0) != '\0') ||
              (auVar76 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar76 >> 0xbf,0) != '\0') ||
            (auVar76 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar76[0x1f] < '\0') {
          _local_28e0 = auVar98;
          _local_2900 = ZEXT1632(auVar17);
          local_2920 = auVar107;
          local_2940 = auVar133;
          local_2960 = auVar104;
          local_2980 = auVar105;
          local_29a0 = auVar103;
        }
        auVar76 = vpcmpeqd_avx2(auVar125,auVar125);
        auVar107 = auVar133;
      }
      auVar136 = ZEXT3264(auVar76);
      auVar123 = ZEXT3264(CONCAT428(0x7f800000,
                                    CONCAT424(0x7f800000,
                                              CONCAT420(0x7f800000,
                                                        CONCAT416(0x7f800000,
                                                                  CONCAT412(0x7f800000,
                                                                            CONCAT48(0x7f800000,
                                                                                                                                                                          
                                                  0x7f8000007f800000)))))));
      auVar121 = ZEXT3264(auVar120);
      auVar109 = ZEXT3264(auVar107);
      uVar4 = *(uint *)((long)&local_2bb0 + uVar57 * 4);
      pGVar6 = (local_2d20->scene->geometries).items[uVar4].ptr;
      uVar3 = pGVar6->mask;
      auVar68._4_4_ = uVar3;
      auVar68._0_4_ = uVar3;
      auVar68._8_4_ = uVar3;
      auVar68._12_4_ = uVar3;
      auVar68._16_4_ = uVar3;
      auVar68._20_4_ = uVar3;
      auVar68._24_4_ = uVar3;
      auVar68._28_4_ = uVar3;
      auVar103 = vpand_avx2(auVar68,*(undefined1 (*) [32])(ray + 0x120));
      auVar104 = vpcmpeqd_avx2(auVar103,_DAT_02020f00);
      auVar103 = auVar72 & ~auVar104;
      local_2ce0 = auVar93;
      local_2cc0 = auVar99;
      if ((((((((auVar103 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar103 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar103 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar103 >> 0x7f,0) != '\0') ||
            (auVar103 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar103 >> 0xbf,0) != '\0') ||
          (auVar103 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar103[0x1f] < '\0') {
        uVar58 = *(undefined4 *)((long)&local_2bc0 + uVar57 * 4);
        auVar72 = vandnps_avx(auVar104,auVar72);
        local_2d00 = (undefined1  [8])uVar55;
        if ((local_2d20->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar99 = vandps_avx(local_2c80,local_2920);
          auVar103 = vrcpps_avx(local_2920);
          auVar102._8_4_ = 0x3f800000;
          auVar102._0_8_ = &DAT_3f8000003f800000;
          auVar102._12_4_ = 0x3f800000;
          auVar102._16_4_ = 0x3f800000;
          auVar102._20_4_ = 0x3f800000;
          auVar102._24_4_ = 0x3f800000;
          auVar102._28_4_ = 0x3f800000;
          auVar71 = vfnmadd213ps_fma(auVar103,local_2920,auVar102);
          auVar71 = vfmadd132ps_fma(ZEXT1632(auVar71),auVar103,auVar103);
          auVar90._8_4_ = 0x219392ef;
          auVar90._0_8_ = 0x219392ef219392ef;
          auVar90._12_4_ = 0x219392ef;
          auVar90._16_4_ = 0x219392ef;
          auVar90._20_4_ = 0x219392ef;
          auVar90._24_4_ = 0x219392ef;
          auVar90._28_4_ = 0x219392ef;
          auVar99 = vcmpps_avx(auVar99,auVar90,5);
          auVar99 = vandps_avx(auVar99,ZEXT1632(auVar71));
          auVar43._4_4_ = auVar99._4_4_ * (float)local_28e0._4_4_;
          auVar43._0_4_ = auVar99._0_4_ * (float)local_28e0._0_4_;
          auVar43._8_4_ = auVar99._8_4_ * fStack_28d8;
          auVar43._12_4_ = auVar99._12_4_ * fStack_28d4;
          auVar43._16_4_ = auVar99._16_4_ * fStack_28d0;
          auVar43._20_4_ = auVar99._20_4_ * fStack_28cc;
          auVar43._24_4_ = auVar99._24_4_ * fStack_28c8;
          auVar43._28_4_ = 0x219392ef;
          local_26e0 = vminps_avx(auVar43,auVar102);
          auVar44._4_4_ = auVar99._4_4_ * (float)local_2900._4_4_;
          auVar44._0_4_ = auVar99._0_4_ * (float)local_2900._0_4_;
          auVar44._8_4_ = auVar99._8_4_ * fStack_28f8;
          auVar44._12_4_ = auVar99._12_4_ * fStack_28f4;
          auVar44._16_4_ = auVar99._16_4_ * fStack_28f0;
          auVar44._20_4_ = auVar99._20_4_ * fStack_28ec;
          auVar44._24_4_ = auVar99._24_4_ * fStack_28e8;
          auVar44._28_4_ = auVar99._28_4_;
          local_26c0 = vminps_avx(auVar44,auVar102);
          local_26a0._4_4_ = uVar58;
          local_26a0._0_4_ = uVar58;
          local_26a0._8_4_ = uVar58;
          local_26a0._12_4_ = uVar58;
          local_26a0._16_4_ = uVar58;
          local_26a0._20_4_ = uVar58;
          local_26a0._24_4_ = uVar58;
          local_26a0._28_4_ = uVar58;
          local_2740 = local_2960._0_8_;
          uStack_2738 = local_2960._8_8_;
          uStack_2730 = local_2960._16_8_;
          uStack_2728 = local_2960._24_8_;
          local_2720 = local_2980._0_8_;
          uStack_2718 = local_2980._8_8_;
          uStack_2710 = local_2980._16_8_;
          uStack_2708 = local_2980._24_8_;
          auVar109 = ZEXT3264(local_29a0);
          local_2700 = local_29a0;
          local_2680 = uVar4;
          uStack_267c = uVar4;
          uStack_2678 = uVar4;
          uStack_2674 = uVar4;
          uStack_2670 = uVar4;
          uStack_266c = uVar4;
          uStack_2668 = uVar4;
          uStack_2664 = uVar4;
          uStack_265c = local_2d20->user->instID[0];
          local_2660 = uStack_265c;
          uStack_2658 = uStack_265c;
          uStack_2654 = uStack_265c;
          uStack_2650 = uStack_265c;
          uStack_264c = uStack_265c;
          uStack_2648 = uStack_265c;
          uStack_2644 = uStack_265c;
          uStack_263c = local_2d20->user->instPrimID[0];
          local_2640 = uStack_263c;
          uStack_2638 = uStack_263c;
          uStack_2634 = uStack_263c;
          uStack_2630 = uStack_263c;
          uStack_262c = uStack_263c;
          uStack_2628 = uStack_263c;
          uStack_2624 = uStack_263c;
          local_2ce0 = *(undefined1 (*) [32])(ray + 0x100);
          auVar99 = vblendvps_avx(local_2ce0,local_2940,auVar72);
          *(undefined1 (*) [32])(ray + 0x100) = auVar99;
          local_2c30.valid = (int *)local_2be0;
          local_2c30.geometryUserPtr = pGVar6->userPtr;
          local_2c30.context = local_2d20->user;
          local_2c30.hit = (RTCHitN *)&local_2740;
          local_2c30.N = 8;
          auVar99 = local_2ce0;
          local_2c30.ray = (RTCRayN *)ray;
          local_2be0 = auVar72;
          _auStack_2cf8 = auVar50;
          if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar109 = ZEXT1664(local_29a0._0_16_);
            auVar121 = ZEXT1664(auVar120._0_16_);
            auVar93 = ZEXT1632(auVar76._0_16_);
            local_2d18 = ray;
            (*pGVar6->occlusionFilterN)(&local_2c30);
            auVar93 = vpcmpeqd_avx2(auVar93,auVar93);
            auVar136 = ZEXT3264(auVar93);
            auVar123 = ZEXT3264(CONCAT428(0x7f800000,
                                          CONCAT424(0x7f800000,
                                                    CONCAT420(0x7f800000,
                                                              CONCAT416(0x7f800000,
                                                                        CONCAT412(0x7f800000,
                                                                                  CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
            auVar126 = ZEXT3264(local_2c80);
            ray = local_2d18;
            auVar99 = local_2ce0;
            auVar93 = local_2ce0;
          }
          local_2ce0 = auVar93;
          auVar72 = vpcmpeqd_avx2(ZEXT1632(ZEXT816(0) << 0x40),local_2be0);
          auVar93 = auVar136._0_32_ & ~auVar72;
          if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar93 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar93 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar93 >> 0x7f,0) == '\0') &&
                (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar93 >> 0xbf,0) == '\0') &&
              (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar93[0x1f]) {
            auVar72 = auVar136._0_32_ ^ auVar72;
          }
          else {
            p_Var7 = local_2d20->args->filter;
            if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
               (((local_2d20->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
              auVar109 = ZEXT1664(auVar109._0_16_);
              auVar121 = ZEXT1664(auVar121._0_16_);
              auVar93 = ZEXT1632(auVar136._0_16_);
              local_2ce0 = auVar99;
              (*p_Var7)(&local_2c30);
              auVar93 = vpcmpeqd_avx2(auVar93,auVar93);
              auVar136 = ZEXT3264(auVar93);
              auVar123 = ZEXT3264(CONCAT428(0x7f800000,
                                            CONCAT424(0x7f800000,
                                                      CONCAT420(0x7f800000,
                                                                CONCAT416(0x7f800000,
                                                                          CONCAT412(0x7f800000,
                                                                                    CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              auVar126 = ZEXT3264(local_2c80);
              auVar99 = local_2ce0;
            }
            auVar93 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),local_2be0);
            auVar72 = auVar136._0_32_ ^ auVar93;
            auVar91._8_4_ = 0xff800000;
            auVar91._0_8_ = 0xff800000ff800000;
            auVar91._12_4_ = 0xff800000;
            auVar91._16_4_ = 0xff800000;
            auVar91._20_4_ = 0xff800000;
            auVar91._24_4_ = 0xff800000;
            auVar91._28_4_ = 0xff800000;
            auVar93 = vblendvps_avx(auVar91,*(undefined1 (*) [32])(local_2c30.ray + 0x100),auVar93);
            *(undefined1 (*) [32])(local_2c30.ray + 0x100) = auVar93;
          }
          auVar93 = vblendvps_avx(auVar99,*(undefined1 (*) [32])local_2d08,auVar72);
          *(undefined1 (*) [32])local_2d08 = auVar93;
        }
        auVar99 = vandnps_avx(auVar72,local_2cc0);
        uVar55 = (ulong)local_2d00;
      }
      auVar115 = ZEXT3264(auVar99);
      if (((((((((auVar99 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                (auVar99 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               (auVar99 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              SUB321(auVar99 >> 0x7f,0) == '\0') &&
             (auVar99 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            SUB321(auVar99 >> 0xbf,0) == '\0') &&
           (auVar99 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar99[0x1f]
          ) || (bVar59 = 2 < uVar57, uVar57 = uVar57 + 1, bVar59)) break;
    }
    auVar73 = vandps_avx(auVar115._0_32_,local_2c00);
    auVar93 = local_2c00 & auVar115._0_32_;
    unaff_R15 = local_2d10;
    if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar93 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar93 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar93 >> 0x7f,0) == '\0') &&
          (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar93 >> 0xbf,0) == '\0') &&
        (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar93[0x1f])
    break;
  }
  local_2c60._0_4_ = auVar136._0_4_ ^ auVar73._0_4_;
  local_2c60._4_4_ = auVar136._4_4_ ^ auVar73._4_4_;
  local_2c60._8_4_ = auVar136._8_4_ ^ auVar73._8_4_;
  local_2c60._12_4_ = auVar136._12_4_ ^ auVar73._12_4_;
  local_2c60._16_4_ = auVar136._16_4_ ^ auVar73._16_4_;
  local_2c60._20_4_ = auVar136._20_4_ ^ auVar73._20_4_;
  local_2c60._24_4_ = auVar136._24_4_ ^ auVar73._24_4_;
  local_2c60._28_4_ = auVar136._28_4_ ^ auVar73._28_4_;
  auVar93 = local_29e0;
LAB_005ad7d7:
  local_2c60 = vorps_avx(auVar93,local_2c60);
  auVar93 = auVar136._0_32_ & ~local_2c60;
  if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar93 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar93 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar93 >> 0x7f,0) == '\0') &&
        (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar93 >> 0xbf,0) == '\0') &&
      (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar93[0x1f]) {
LAB_005ad810:
    iVar51 = 3;
  }
  else {
    auVar92._8_4_ = 0xff800000;
    auVar92._0_8_ = 0xff800000ff800000;
    auVar92._12_4_ = 0xff800000;
    auVar92._16_4_ = 0xff800000;
    auVar92._20_4_ = 0xff800000;
    auVar92._24_4_ = 0xff800000;
    auVar92._28_4_ = 0xff800000;
    local_2a00 = vblendvps_avx(local_2a00,auVar92,local_2c60);
    iVar51 = 0;
  }
LAB_005ad813:
  if (iVar51 == 3) {
    auVar93 = vandps_avx(local_29c0,local_2c60);
    auVar78._8_4_ = 0xff800000;
    auVar78._0_8_ = 0xff800000ff800000;
    auVar78._12_4_ = 0xff800000;
    auVar78._16_4_ = 0xff800000;
    auVar78._20_4_ = 0xff800000;
    auVar78._24_4_ = 0xff800000;
    auVar78._28_4_ = 0xff800000;
    auVar93 = vmaskmovps_avx(auVar93,auVar78);
    *(undefined1 (*) [32])local_2d08 = auVar93;
    return;
  }
  goto LAB_005acce9;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }